

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::factorizeColumnRational
          (SoPlexBase<double> *this,SolRational *sol,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusRows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusCols,bool *stoppedTime,
          bool *stoppedIter,bool *error,bool *optimal)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  Status SVar4;
  int iVar5;
  Verbosity VVar6;
  int iVar7;
  VarStatus *pVVar8;
  int *piVar9;
  Rational *pRVar10;
  SSVectorBase<double> *pSVar11;
  RangeType *pRVar12;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar13;
  SPxOut *pSVar14;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar15;
  SVectorRational *val;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_RCX;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_RDX;
  Timer *in_RSI;
  SoPlexBase<double> *in_RDI;
  undefined1 *in_R8;
  undefined1 *in_R9;
  Real RVar16;
  Real RVar17;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 *in_stack_00000008;
  byte *in_stack_00000010;
  int i_7;
  Verbosity old_verbosity_10;
  int i_6;
  Verbosity old_verbosity_9;
  int i_5;
  int i_4;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  int i_3;
  int i_2;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  int i_1;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int i;
  int j;
  bool dualFeasible;
  bool primalFeasible;
  Rational dualViolation;
  Rational primalViolation;
  Rational violation;
  VectorRational *basicDual;
  VectorRational *basicPrimal;
  VectorRational *basicDualRhs;
  VectorRational *basicPrimalRhs;
  Verbosity old_verbosity;
  int numBasicRows;
  bool loadMatrix;
  int matrixdim;
  bool maximizing;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6b8;
  fmtflags fVar18;
  SoPlexBase<double> *in_stack_fffffffffffff6c0;
  SoPlexBase<double> *in_stack_fffffffffffff6c8;
  SoPlexBase<double> *this_00;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_fffffffffffff6d0;
  self_type *in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  *in_stack_fffffffffffff6e8;
  undefined4 in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f4;
  bool *in_stack_fffffffffffff6f8;
  SoPlexBase<double> *in_stack_fffffffffffff700;
  byte local_8c9;
  undefined1 in_stack_fffffffffffff753;
  uint in_stack_fffffffffffff754;
  Rational *in_stack_fffffffffffff758;
  type_conflict5 local_89b;
  type_conflict5 local_89a;
  SoPlexBase<double> *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff780;
  Status SVar19;
  Rational *in_stack_fffffffffffff788;
  type_conflict5 local_84b;
  type_conflict5 local_84a;
  type_conflict5 local_81f;
  type_conflict5 local_81e;
  bool local_66d;
  undefined1 local_628 [76];
  Verbosity local_5dc;
  Verbosity local_5d8;
  undefined8 local_5d4;
  Verbosity local_5cc;
  data_type local_5c8;
  uint local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  Status local_568 [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  uint local_4b8;
  undefined4 local_4b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  undefined4 local_444;
  undefined4 local_440;
  int local_43c;
  undefined8 local_438;
  Verbosity local_430 [3];
  int local_424;
  undefined4 local_420;
  int local_41c;
  SVSetBase<double> local_418;
  int local_394;
  Verbosity local_390;
  Verbosity local_38c [3];
  SVSetBase<double> local_380;
  undefined1 local_318 [128];
  SLinSolver<double> *local_298;
  SolRational *local_290;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_288;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_280;
  Verbosity local_278;
  Verbosity local_274;
  int local_270;
  bool local_269;
  int local_268;
  byte local_261;
  undefined1 *local_260;
  undefined1 *local_258;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_250;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_248;
  Timer *local_240;
  undefined1 *local_230;
  undefined1 *local_228;
  double *local_220;
  SoPlexBase<double> *local_218;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_210;
  Status *local_208;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_200;
  IdList<soplex::SVSetBase<double>::DLPSV> *local_1f8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1f0;
  SoPlexBase<double> *local_1e8;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *local_1e0;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *local_1d8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1d0;
  SPxOut *local_1c8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1c0;
  Rational *local_1b8;
  Timer *local_1b0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1a8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1a0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_198;
  double *local_190;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_188;
  double *local_180;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_178;
  double *local_170;
  undefined1 *local_168;
  double *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  Rational *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  SSVectorBase<double> *local_108;
  SSVectorBase<double> *local_100;
  SSVectorBase<double> *local_f8;
  SSVectorBase<double> *local_f0;
  SSVectorBase<double> *local_e8;
  SSVectorBase<double> *local_e0;
  SSVectorBase<double> *local_d8;
  SSVectorBase<double> *local_d0;
  Rational *local_c8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_c0;
  Rational *local_b8;
  DataKey local_b0;
  pointer local_a8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_a0;
  pointer local_98;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_90;
  pointer local_88;
  double *local_80;
  SVSetBase<double> *local_78;
  undefined1 *local_70;
  SVSetBase<double> *local_68;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_60;
  pointer local_58;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_50;
  int *local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  SVSetBase<double> *local_28;
  SVSetBase<double> *local_20;
  pointer local_18;
  pointer local_10;
  pointer local_8;
  
  local_260 = in_R9;
  local_258 = in_R8;
  local_250 = in_RCX;
  local_248 = in_RDX;
  local_240 = in_RSI;
  (*in_RDI->_statistics->rationalTime->_vptr_Timer[3])();
  *local_258 = 0;
  *local_260 = 0;
  *in_stack_00000008 = 0;
  *in_stack_00000010 = 0;
  iVar3 = intParam(in_RDI,OBJSENSE);
  local_261 = iVar3 == 1;
  local_268 = numRowsRational((SoPlexBase<double> *)0x47268c);
  SVar4 = SLUFactorRational::status(&in_RDI->_rationalLUSolver);
  local_66d = true;
  if (SVar4 != UNLOADED) {
    SVar4 = SLUFactorRational::status(&in_RDI->_rationalLUSolver);
    local_66d = SVar4 == TIME;
  }
  iVar3 = local_268;
  local_269 = local_66d;
  if ((local_66d == false) &&
     ((iVar5 = SLUFactorRational::dim(&in_RDI->_rationalLUSolver), iVar7 = local_268, iVar3 != iVar5
      || (iVar3 = DataArray<int>::size(&in_RDI->_rationalLUSolverBind), iVar7 != iVar3)))) {
    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
       (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 0 < (int)VVar6)) {
      local_274 = SPxOut::getVerbosity(&in_RDI->spxout);
      local_278 = WARNING;
      SPxOut::setVerbosity(&in_RDI->spxout,&local_278);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
      SPxOut::setVerbosity(&in_RDI->spxout,&local_274);
    }
    local_269 = true;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_stack_fffffffffffff758,in_stack_fffffffffffff754,(bool)in_stack_fffffffffffff753);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_stack_fffffffffffff758,in_stack_fffffffffffff754,(bool)in_stack_fffffffffffff753);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_stack_fffffffffffff758,in_stack_fffffffffffff754,(bool)in_stack_fffffffffffff753);
  iVar3 = numColsRational((SoPlexBase<double> *)0x47288b);
  if (local_268 < iVar3) {
    numColsRational((SoPlexBase<double> *)0x4728a1);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)in_stack_fffffffffffff758,in_stack_fffffffffffff754,(bool)in_stack_fffffffffffff753);
  if ((local_269 & 1U) != 0) {
    DataArray<int>::reSize
              ((DataArray<int> *)in_stack_fffffffffffff6c0,
               (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
  }
  local_290 = &in_RDI->_workSol;
  local_280 = &(in_RDI->_workSol)._slacks;
  local_288 = &(in_RDI->_workSol)._redCost;
  local_298 = (SLinSolver<double> *)&(in_RDI->_workSol)._dual;
  local_230 = local_318 + 0x40;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x47295f);
  local_228 = local_318;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x47297c);
  local_220 = &local_380.super_ClassArray<soplex::Nonzero<double>_>.memFactor;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x47299d);
  local_380.super_ClassArray<soplex::Nonzero<double>_>.data._7_1_ = 0;
  local_380.super_ClassArray<soplex::Nonzero<double>_>.data._6_1_ = 0;
  local_380.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ = 0;
  for (local_380.super_ClassArray<soplex::Nonzero<double>_>.themax = 0;
      iVar3 = local_380.super_ClassArray<soplex::Nonzero<double>_>.themax,
      iVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_248), iVar3 < iVar7;
      local_380.super_ClassArray<soplex::Nonzero<double>_>.themax =
           local_380.super_ClassArray<soplex::Nonzero<double>_>.themax + 1) {
    pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_248,local_380.super_ClassArray<soplex::Nonzero<double>_>.themax);
    if ((*pVVar8 == BASIC) &&
       ((int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data < local_268)) {
      local_380.super_ClassArray<soplex::Nonzero<double>_>.thesize = 0;
      local_40 = (pointer)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                        *)in_stack_fffffffffffff6c0,
                                       (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
      local_48 = &local_380.super_ClassArray<soplex::Nonzero<double>_>.thesize;
      local_38 = (pointer)local_48;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_fffffffffffff6c0,(longlong)in_stack_fffffffffffff6b8);
      local_380.super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray._4_4_ = 0;
      local_50 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)in_stack_fffffffffffff6c0,
                              (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
      local_58 = (pointer)((long)&local_380.super_ClassArray<soplex::Nonzero<double>_>.
                                  _vptr_ClassArray + 4);
      local_30 = local_58;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_fffffffffffff6c0,(longlong)in_stack_fffffffffffff6b8);
      if ((local_269 & 1U) != 0) {
        iVar3 = -1 - local_380.super_ClassArray<soplex::Nonzero<double>_>.themax;
        piVar9 = DataArray<int>::operator[]
                           (&in_RDI->_rationalLUSolverBind,
                            (int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data);
        *piVar9 = iVar3;
      }
      local_380.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ =
           (int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data + 1;
    }
    else {
      pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_248,local_380.super_ClassArray<soplex::Nonzero<double>_>.themax);
      if (*pVVar8 == ON_LOWER) {
        pRVar10 = lhsRational(in_stack_fffffffffffff6c0,
                              (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        local_b0 = (DataKey)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                          *)in_stack_fffffffffffff6c0,
                                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        local_b8 = pRVar10;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffff6c0,
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffff6b8);
      }
      else {
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_248,local_380.super_ClassArray<soplex::Nonzero<double>_>.themax);
        if (*pVVar8 == ON_UPPER) {
          pRVar10 = rhsRational(in_stack_fffffffffffff6c0,
                                (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          local_c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff6c0,
                                  (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          local_c8 = pRVar10;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6c0,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6b8);
        }
        else {
          pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_248,local_380.super_ClassArray<soplex::Nonzero<double>_>.themax)
          ;
          if (*pVVar8 == ZERO) {
            local_380.super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray._0_4_ = 0;
            local_60 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff6c0,
                                    (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            local_68 = &local_380;
            local_28 = local_68;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6c0,(longlong)in_stack_fffffffffffff6b8);
          }
          else {
            pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_248,
                                local_380.super_ClassArray<soplex::Nonzero<double>_>.themax);
            if (*pVVar8 != FIXED) {
              pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_248,
                                  local_380.super_ClassArray<soplex::Nonzero<double>_>.themax);
              if (*pVVar8 == UNDEFINED) {
                if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                   (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
                  local_38c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
                  local_38c[1] = 3;
                  SPxOut::setVerbosity(&in_RDI->spxout,local_38c + 1);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,
                                     (char *)in_stack_fffffffffffff6b8);
                  SPxOut::setVerbosity(&in_RDI->spxout,local_38c + 2);
                }
                *in_stack_00000008 = 1;
              }
              else {
                if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                   (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
                  local_38c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
                  local_390 = INFO1;
                  SPxOut::setVerbosity(&in_RDI->spxout,&local_390);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,
                                     (char *)in_stack_fffffffffffff6b8);
                  SPxOut::setVerbosity(&in_RDI->spxout,local_38c);
                }
                *in_stack_00000008 = 1;
              }
              goto LAB_00475832;
            }
            pSVar11 = (SSVectorBase<double> *)
                      lhsRational(in_stack_fffffffffffff6c0,
                                  (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            local_d0 = (SSVectorBase<double> *)
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff6c0,
                                    (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            local_d8 = pSVar11;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6c0,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6b8);
          }
        }
      }
    }
  }
  local_270 = (int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data;
  for (local_394 = 0; iVar3 = local_394,
      iVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_250), iVar3 < iVar7;
      local_394 = local_394 + 1) {
    pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_250,local_394);
    if ((*pVVar8 == BASIC) &&
       ((int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data < local_268)) {
      objRational(in_stack_fffffffffffff6c8,(int)((ulong)in_stack_fffffffffffff6c0 >> 0x20));
      local_1f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)in_stack_fffffffffffff6c0,
                               (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
      local_1f8 = &local_418.list;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_fffffffffffff6c0,
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_fffffffffffff6b8);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x473024);
      iVar3 = local_394;
      if ((local_269 & 1U) != 0) {
        piVar9 = DataArray<int>::operator[]
                           (&in_RDI->_rationalLUSolverBind,
                            (int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data);
        *piVar9 = iVar3;
      }
      local_380.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ =
           (int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data + 1;
    }
    else {
      pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_250,local_394);
      if (*pVVar8 == ON_LOWER) {
        lowerRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        boost::multiprecision::operator-
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                    *)in_stack_fffffffffffff6b8);
        colVectorRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
        ;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
        ::
        multAdd<boost::multiprecision::detail::expression<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                  ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   in_stack_fffffffffffff6e8,
                   (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
      }
      else {
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_250,local_394);
        if (*pVVar8 == ON_UPPER) {
          upperRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          boost::multiprecision::operator-
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff6b8);
          colVectorRational(in_stack_fffffffffffff6c0,
                            (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
          ::
          multAdd<boost::multiprecision::detail::expression<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                    ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                     in_stack_fffffffffffff6e8,
                     (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
        }
        else {
          pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_250,local_394);
          if (*pVVar8 != ZERO) {
            pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_250,local_394);
            if (*pVVar8 != FIXED) {
              pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_250,local_394);
              if (*pVVar8 == UNDEFINED) {
                if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                   (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
                  local_418.set.theitem._4_4_ = SPxOut::getVerbosity(&in_RDI->spxout);
                  local_418.set.theitem._0_4_ = 3;
                  SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&local_418.set);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,
                                     (char *)in_stack_fffffffffffff6b8);
                  SPxOut::setVerbosity
                            (&in_RDI->spxout,(Verbosity *)((long)&local_418.set.theitem + 4));
                }
                *in_stack_00000008 = 1;
              }
              else {
                if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                   (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
                  local_418.super_ClassArray<soplex::Nonzero<double>_>.memFactor._4_4_ =
                       SPxOut::getVerbosity(&in_RDI->spxout);
                  local_418.super_ClassArray<soplex::Nonzero<double>_>.memFactor._0_4_ = 3;
                  SPxOut::setVerbosity
                            (&in_RDI->spxout,
                             (Verbosity *)
                             &local_418.super_ClassArray<soplex::Nonzero<double>_>.memFactor);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,
                                     (char *)in_stack_fffffffffffff6b8);
                  SPxOut::setVerbosity
                            (&in_RDI->spxout,
                             (Verbosity *)
                             ((long)&local_418.super_ClassArray<soplex::Nonzero<double>_>.memFactor
                             + 4));
                }
                *in_stack_00000008 = 1;
              }
              goto LAB_00475832;
            }
            lowerRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
            ;
            boost::multiprecision::operator-
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffff6b8);
            colVectorRational(in_stack_fffffffffffff6c0,
                              (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
            ::
            multAdd<boost::multiprecision::detail::expression<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                       in_stack_fffffffffffff6e8,
                       (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
          }
        }
      }
    }
  }
  if ((int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data == local_268) {
    if ((local_269 & 1U) != 0) {
      _computeBasisInverseRational(in_stack_fffffffffffff770);
    }
    SVar4 = SLUFactorRational::status(&in_RDI->_rationalLUSolver);
    if (SVar4 == TIME) {
      *local_258 = 1;
      goto LAB_00475858;
    }
    SVar4 = SLUFactorRational::status(&in_RDI->_rationalLUSolver);
    if (SVar4 != OK) {
      *in_stack_00000008 = 1;
      goto LAB_00475858;
    }
    RVar16 = realParam(in_RDI,TIMELIMIT);
    RVar17 = realParam(in_RDI,INFTY);
    if (RVar17 <= RVar16) {
      SLUFactorRational::setTimeLimit(&in_RDI->_rationalLUSolver,-1.0);
    }
    else {
      RVar16 = realParam(in_RDI,TIMELIMIT);
      (*in_RDI->_statistics->solvingTime->_vptr_Timer[6])();
      SLUFactorRational::setTimeLimit(&in_RDI->_rationalLUSolver,RVar16 - extraout_XMM0_Qa);
    }
    SLUFactorRational::solveRight
              ((SLUFactorRational *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               (VectorRational *)in_stack_fffffffffffff6d8,
               (VectorRational *)in_stack_fffffffffffff6d0);
    RVar16 = SLUFactorRational::getSolveTime((SLUFactorRational *)0x47367c);
    in_RDI->_statistics->luSolveTimeRational = in_RDI->_statistics->luSolveTimeRational + RVar16;
    SLUFactorRational::resetCounters((SLUFactorRational *)in_stack_fffffffffffff6c0);
    bVar1 = _isSolveStopped(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
                            (bool *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
    if (bVar1) {
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 3 < (int)VVar6)) {
        local_418.super_ClassArray<soplex::Nonzero<double>_>.thesize =
             SPxOut::getVerbosity(&in_RDI->spxout);
        local_418.super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray._4_4_ = 4;
        SPxOut::setVerbosity
                  (&in_RDI->spxout,
                   (Verbosity *)
                   ((long)&local_418.super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + 4
                   ));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
        SPxOut::setVerbosity
                  (&in_RDI->spxout,
                   (Verbosity *)&local_418.super_ClassArray<soplex::Nonzero<double>_>.thesize);
      }
      goto LAB_00475858;
    }
    local_380.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ = 0;
    local_418.super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray._0_4_ = 0;
    local_70 = local_318;
    local_78 = &local_418;
    local_20 = local_78;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)in_stack_fffffffffffff6c0,(longlong)in_stack_fffffffffffff6b8);
    local_380.super_ClassArray<soplex::Nonzero<double>_>.data._7_1_ = 1;
    for (local_41c = 0; iVar3 = local_41c,
        iVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_248), iVar3 < iVar7;
        local_41c = local_41c + 1) {
      pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_248,local_41c);
      if (*pVVar8 == BASIC) {
        local_e8 = (SSVectorBase<double> *)
                   lhsRational(in_stack_fffffffffffff6c0,
                               (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        local_e0 = (SSVectorBase<double> *)(local_318 + 0x40);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffff6c0,
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffff6b8);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::operator+=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                     in_stack_fffffffffffff6d8);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff6b8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x4738f7);
        if (tVar2) {
          local_380.super_ClassArray<soplex::Nonzero<double>_>.data._7_1_ = 0;
          local_f0 = (SSVectorBase<double> *)local_318;
          local_f8 = (SSVectorBase<double> *)(local_318 + 0x40);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6c0,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6b8);
        }
        local_108 = (SSVectorBase<double> *)
                    rhsRational(in_stack_fffffffffffff6c0,
                                (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        local_100 = (SSVectorBase<double> *)(local_318 + 0x40);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffff6c0,
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffff6b8);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::operator+=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                     in_stack_fffffffffffff6d8);
        local_420 = 0xffffffff;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff6b8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x473a04);
        if (tVar2) {
          local_380.super_ClassArray<soplex::Nonzero<double>_>.data._7_1_ = 0;
          local_110 = local_318;
          local_118 = local_318 + 0x40;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6c0,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6b8);
        }
        local_380.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ =
             (int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data + 1;
      }
    }
    for (local_424 = 0; iVar3 = local_424,
        iVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_250), iVar3 < iVar7;
        local_424 = local_424 + 1) {
      pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_250,local_424);
      if (*pVVar8 == BASIC) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        lowerRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff6b8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x473b29);
        if (tVar2) {
          local_128 = lowerRational(in_stack_fffffffffffff6c0,
                                    (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          local_120 = local_318 + 0x40;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6c0,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6b8);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::operator-=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                       in_stack_fffffffffffff6d8);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff6b8,
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)0x473bd4);
          if (tVar2) {
            local_380.super_ClassArray<soplex::Nonzero<double>_>.data._7_1_ = 0;
            local_130 = local_318;
            local_138 = local_318 + 0x40;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6c0,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6b8);
          }
        }
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        upperRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff6b8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x473c7e);
        if (tVar2) {
          local_148 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                    *)in_stack_fffffffffffff6c0,
                                   (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          local_140 = local_318 + 0x40;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6c0,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6b8);
          upperRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::operator-=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                       in_stack_fffffffffffff6d8);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff6b8,
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)0x473d26);
          if (tVar2) {
            local_380.super_ClassArray<soplex::Nonzero<double>_>.data._7_1_ = 0;
            local_150 = local_318;
            local_158 = local_318 + 0x40;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6c0,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6b8);
          }
        }
        local_380.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ =
             (int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data + 1;
      }
    }
    if ((((local_380.super_ClassArray<soplex::Nonzero<double>_>.data._7_1_ & 1) == 0) &&
        (in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8)) &&
       (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
      local_430[2] = SPxOut::getVerbosity(&in_RDI->spxout);
      local_430[1] = 3;
      SPxOut::setVerbosity(&in_RDI->spxout,local_430 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
      SPxOut::setVerbosity(&in_RDI->spxout,local_430 + 2);
    }
    RVar16 = realParam(in_RDI,TIMELIMIT);
    RVar17 = realParam(in_RDI,INFTY);
    if (RVar17 <= RVar16) {
      SLUFactorRational::setTimeLimit(&in_RDI->_rationalLUSolver,-1.0);
    }
    else {
      RVar16 = realParam(in_RDI,TIMELIMIT);
      (*in_RDI->_statistics->solvingTime->_vptr_Timer[6])();
      SLUFactorRational::setTimeLimit(&in_RDI->_rationalLUSolver,RVar16 - extraout_XMM0_Qa_00);
    }
    SLUFactorRational::solveLeft
              ((SLUFactorRational *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               (VectorRational *)in_stack_fffffffffffff6d8,
               (VectorRational *)in_stack_fffffffffffff6d0);
    RVar16 = SLUFactorRational::getSolveTime((SLUFactorRational *)0x473f6a);
    in_RDI->_statistics->luSolveTimeRational = in_RDI->_statistics->luSolveTimeRational + RVar16;
    SLUFactorRational::resetCounters((SLUFactorRational *)in_stack_fffffffffffff6c0);
    bVar1 = _isSolveStopped(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
                            (bool *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
    if (bVar1) {
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 3 < (int)VVar6)) {
        local_430[0] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_438._4_4_ = 4;
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)((long)&local_438 + 4));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
        SPxOut::setVerbosity(&in_RDI->spxout,local_430);
      }
      goto LAB_00475858;
    }
    local_438._0_4_ = 0;
    local_80 = &local_380.super_ClassArray<soplex::Nonzero<double>_>.memFactor;
    local_88 = (pointer)&local_438;
    local_18 = local_88;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)in_stack_fffffffffffff6c0,(longlong)in_stack_fffffffffffff6b8);
    local_380.super_ClassArray<soplex::Nonzero<double>_>.data._6_1_ = 1;
    for (local_43c = 0; iVar3 = local_43c,
        iVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_248), iVar3 < iVar7;
        local_43c = local_43c + 1) {
      pRVar12 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                          (&in_RDI->_rowTypes,local_43c);
      if ((*pRVar12 == RANGETYPE_FIXED) &&
         ((pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                              (local_248,local_43c), *pVVar8 == ON_LOWER ||
          (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                              (local_248,local_43c), *pVVar8 == ON_UPPER)))) {
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_248,local_43c);
        *pVVar8 = FIXED;
      }
      pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_248,local_43c);
      if ((*pVVar8 != BASIC) &&
         (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_248,local_43c), *pVVar8 != FIXED)) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        local_440 = 0;
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
        if (tVar2) {
          if (((local_261 & 1) == 0) ||
             (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_248,local_43c), *pVVar8 == ON_LOWER)) {
            local_81e = false;
            if ((local_261 & 1) == 0) {
              pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_248,local_43c);
              local_81e = false;
              if (*pVVar8 != ON_UPPER) goto LAB_00474279;
            }
          }
          else {
LAB_00474279:
            pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_248,local_43c);
            local_81f = true;
            if (*pVVar8 == ZERO) {
              rhsRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
              ;
              local_444 = 0;
              local_81f = boost::multiprecision::operator!=
                                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
            }
            local_81e = local_81f;
          }
          if (local_81e != false) {
            local_380.super_ClassArray<soplex::Nonzero<double>_>.data._6_1_ = 0;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff6c0,
                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            boost::multiprecision::operator-
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffff6b8);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::operator=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)in_stack_fffffffffffff6d0,
                        (expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
                         *)in_stack_fffffffffffff6c8);
            tVar2 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)in_stack_fffffffffffff6b8,
                               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)0x47436d);
            if (tVar2) {
              local_160 = &local_380.super_ClassArray<soplex::Nonzero<double>_>.memFactor;
              local_168 = local_318 + 0x40;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)in_stack_fffffffffffff6c0,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)in_stack_fffffffffffff6b8);
            }
            fVar18 = (fmtflags)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff6c0,fVar18);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff6c8,(streamsize)in_stack_fffffffffffff6c0,
                             fVar18);
            pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_248,local_43c);
            lhsRational(in_stack_fffffffffffff6c0,fVar18);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff6c8,(streamsize)in_stack_fffffffffffff6c0,
                             fVar18);
            rhsRational(in_stack_fffffffffffff6c0,fVar18);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff6c8,(streamsize)in_stack_fffffffffffff6c0,
                             fVar18);
            in_stack_fffffffffffff6b8 = &local_4b0;
            SPxOut::
            debug<soplex::SoPlexBase<double>,_const_char_(&)[89],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soplex::SPxSolverBase<double>::VarStatus_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (in_RDI,(char (*) [89])
                              "negative dual multliplier for row {} with dual {} and status {} and [lhs,rhs] = [{},{}]\n"
                       ,&local_43c,&local_470,pVVar8,&local_490,in_stack_fffffffffffff6b8);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)&local_470);
          }
        }
        else {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
          ;
          local_4b4._0_1_ = false;
          local_4b4._1_1_ = false;
          local_4b4._2_1_ = false;
          local_4b4._3_1_ = 0;
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
          if (tVar2) {
            if (((local_261 & 1) == 0) ||
               (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_248,local_43c), *pVVar8 == ON_UPPER)) {
              local_84a = false;
              if ((local_261 & 1) == 0) {
                pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_248,local_43c);
                local_84a = false;
                if (*pVVar8 != ON_LOWER) goto LAB_004745ff;
              }
            }
            else {
LAB_004745ff:
              pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_248,local_43c);
              local_84b = true;
              if (*pVVar8 == ZERO) {
                lhsRational(in_stack_fffffffffffff6c0,
                            (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
                local_4b8 = 0;
                local_84b = boost::multiprecision::operator==
                                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                        *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0
                                      );
              }
              local_84a = local_84b;
            }
            if (local_84a != false) {
              local_380.super_ClassArray<soplex::Nonzero<double>_>.data._6_1_ = 0;
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff6c0,
                           (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
              tVar2 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)in_stack_fffffffffffff6b8,
                                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)0x4746c5);
              if (tVar2) {
                local_178 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                          *)in_stack_fffffffffffff6c0,
                                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
                local_170 = &local_380.super_ClassArray<soplex::Nonzero<double>_>.memFactor;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)in_stack_fffffffffffff6c0,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)in_stack_fffffffffffff6b8);
              }
              fVar18 = (fmtflags)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff6c0,fVar18);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)in_stack_fffffffffffff6c8,(streamsize)in_stack_fffffffffffff6c0,
                               fVar18);
              pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_248,local_43c);
              lhsRational(in_stack_fffffffffffff6c0,fVar18);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)in_stack_fffffffffffff6c8,(streamsize)in_stack_fffffffffffff6c0,
                               fVar18);
              in_stack_fffffffffffff788 = rhsRational(in_stack_fffffffffffff6c0,fVar18);
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)in_stack_fffffffffffff6c8,(streamsize)in_stack_fffffffffffff6c0,
                               fVar18);
              in_stack_fffffffffffff6b8 = &local_518;
              SPxOut::
              debug<soplex::SoPlexBase<double>,_const_char_(&)[89],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soplex::SPxSolverBase<double>::VarStatus_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (in_RDI,(char (*) [89])
                                "positive dual multliplier for row {} with dual {} and status {} and [lhs,rhs] = [{},{}]\n"
                         ,&local_43c,&local_4d8,pVVar8,&local_4f8,in_stack_fffffffffffff6b8);
              std::__cxx11::string::~string((string *)&local_518);
              std::__cxx11::string::~string((string *)&local_4f8);
              std::__cxx11::string::~string((string *)&local_4d8);
            }
          }
        }
      }
    }
    local_568[0x13] = 0;
    while (SVar19 = local_568[0x13],
          iVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_250),
          SVar19 < iVar3) {
      pRVar12 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                          (&in_RDI->_colTypes,local_568[0x13]);
      if ((*pRVar12 == RANGETYPE_FIXED) &&
         ((pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                              (local_250,local_568[0x13]), *pVVar8 == ON_LOWER ||
          (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                              (local_250,local_568[0x13]), *pVVar8 == ON_UPPER)))) {
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_250,local_568[0x13]);
        *pVVar8 = FIXED;
      }
      pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_250,local_568[0x13]);
      if ((*pVVar8 != BASIC) &&
         (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_250,local_568[0x13]), *pVVar8 != FIXED)) {
        colVectorRational(in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
        ;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_stack_fffffffffffff788,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)CONCAT44(SVar19,in_stack_fffffffffffff780));
        local_200 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                  *)in_stack_fffffffffffff6c0,
                                 (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        local_208 = local_568;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffff6c0,
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffff6b8);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x474a55);
        objRational(in_stack_fffffffffffff6c8,(int)((ulong)in_stack_fffffffffffff6c0 >> 0x20));
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::operator-=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                     in_stack_fffffffffffff6d8);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x474aad);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        local_5ac = 0;
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
        if (tVar2) {
          if (((local_261 & 1) == 0) ||
             (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_250,local_568[0x13]), *pVVar8 == ON_LOWER)) {
            local_89a = false;
            if ((local_261 & 1) == 0) {
              pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_250,local_568[0x13]);
              local_89a = false;
              if (*pVVar8 != ON_UPPER) goto LAB_00474b5f;
            }
          }
          else {
LAB_00474b5f:
            pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_250,local_568[0x13]);
            local_89b = true;
            if (*pVVar8 == ZERO) {
              in_stack_fffffffffffff758 =
                   upperRational(in_stack_fffffffffffff6c0,
                                 (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
              local_5b0 = 0;
              local_89b = boost::multiprecision::operator!=
                                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
              in_stack_fffffffffffff754 = CONCAT13(local_89b,(int3)in_stack_fffffffffffff754);
            }
            local_89a = local_89b;
          }
          if (local_89a != false) {
            local_380.super_ClassArray<soplex::Nonzero<double>_>.data._6_1_ = 0;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff6c0,
                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            tVar2 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)in_stack_fffffffffffff6b8,
                               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)0x474c2c);
            in_stack_fffffffffffff754 =
                 CONCAT13((char)(in_stack_fffffffffffff754 >> 0x18),
                          CONCAT12(tVar2,(short)in_stack_fffffffffffff754));
            if (tVar2) {
              local_188 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                        *)in_stack_fffffffffffff6c0,
                                       (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
              local_180 = &local_380.super_ClassArray<soplex::Nonzero<double>_>.memFactor;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)in_stack_fffffffffffff6c0,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)in_stack_fffffffffffff6b8);
            }
          }
          local_5b4._0_1_ = true;
          local_5b4._1_1_ = true;
          local_5b4._2_1_ = true;
          local_5b4._3_1_ = 0xff;
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
        }
        else {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
          ;
          local_5b8 = 0;
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
          in_stack_fffffffffffff754 =
               CONCAT22((short)(in_stack_fffffffffffff754 >> 0x10),
                        CONCAT11(tVar2,(char)in_stack_fffffffffffff754));
          iVar3 = (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
          if (tVar2) {
            local_5c8.la[1]._4_4_ = 0xffffffff;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff6c0,iVar3);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
            if (((local_261 & 1) == 0) ||
               (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_250,local_568[0x13]), *pVVar8 == ON_UPPER)) {
              in_stack_fffffffffffff754 = in_stack_fffffffffffff754 & 0xffffff00;
              if ((local_261 & 1) == 0) {
                pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_250,local_568[0x13]);
                in_stack_fffffffffffff754 = in_stack_fffffffffffff754 & 0xffffff00;
                if (*pVVar8 != ON_LOWER) goto LAB_00474ddf;
              }
            }
            else {
LAB_00474ddf:
              pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_250,local_568[0x13]);
              in_stack_fffffffffffff753 = true;
              if (*pVVar8 == ZERO) {
                lowerRational(in_stack_fffffffffffff6c0,
                              (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
                local_5c8.la[1]._0_4_ = 0;
                in_stack_fffffffffffff753 =
                     boost::multiprecision::operator!=
                               ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
              }
              in_stack_fffffffffffff754 =
                   CONCAT31((int3)(in_stack_fffffffffffff754 >> 8),in_stack_fffffffffffff753);
            }
            if ((char)in_stack_fffffffffffff754 != '\0') {
              local_380.super_ClassArray<soplex::Nonzero<double>_>.data._6_1_ = 0;
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff6c0,
                           (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
              tVar2 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)in_stack_fffffffffffff6b8,
                                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)0x474eac);
              if (tVar2) {
                local_198 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                          *)in_stack_fffffffffffff6c0,
                                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
                local_190 = &local_380.super_ClassArray<soplex::Nonzero<double>_>.memFactor;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)in_stack_fffffffffffff6c0,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)in_stack_fffffffffffff6b8);
              }
            }
          }
          else {
            local_5c8.la[0]._4_4_ = 0xffffffff;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff6c0,iVar3);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)in_stack_fffffffffffff6c8,(int *)in_stack_fffffffffffff6c0);
          }
        }
      }
      local_568[0x13] = local_568[0x13] + 1;
    }
    if ((((local_380.super_ClassArray<soplex::Nonzero<double>_>.data._6_1_ & 1) == 0) &&
        (in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8)) &&
       (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
      local_5c8.ld.capacity = SPxOut::getVerbosity(&in_RDI->spxout);
      local_5cc = INFO1;
      SPxOut::setVerbosity(&in_RDI->spxout,&local_5cc);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)local_5c8.la);
    }
    local_8c9 = 0;
    if ((local_380.super_ClassArray<soplex::Nonzero<double>_>.data._7_1_ & 1) != 0) {
      local_8c9 = local_380.super_ClassArray<soplex::Nonzero<double>_>.data._6_1_;
    }
    *in_stack_00000010 = local_8c9 & 1;
    if (((*in_stack_00000010 & 1) != 0) || (bVar1 = boolParam(in_RDI,RATFACJUMP), bVar1)) {
      in_RDI->_hasBasis = true;
      if (local_248 != &in_RDI->_basisStatusRows) {
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
                  (in_stack_fffffffffffff6d0,
                   (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff6c8)
        ;
      }
      if (local_250 != &in_RDI->_basisStatusCols) {
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
                  (in_stack_fffffffffffff6d0,
                   (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff6c8)
        ;
      }
      numColsRational((SoPlexBase<double> *)0x47510a);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffff758,in_stack_fffffffffffff754,(bool)in_stack_fffffffffffff753
             );
      local_380.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ = local_270;
      for (local_5d4._4_4_ = 0; iVar3 = local_5d4._4_4_,
          iVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(local_250),
          iVar3 < iVar7; local_5d4._4_4_ = local_5d4._4_4_ + 1) {
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_250,local_5d4._4_4_);
        if (*pVVar8 == BASIC) {
          pnVar13 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                  *)in_stack_fffffffffffff6c0,
                                 (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          local_1a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                    *)in_stack_fffffffffffff6c0,
                                   (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          local_1a8 = pnVar13;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6c0,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6b8);
          local_380.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ =
               (int)local_380.super_ClassArray<soplex::Nonzero<double>_>.data + 1;
        }
        else {
          pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_250,local_5d4._4_4_);
          if (*pVVar8 == ON_LOWER) {
            pRVar10 = lowerRational(in_stack_fffffffffffff6c0,
                                    (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            local_1b0 = (Timer *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                               *)in_stack_fffffffffffff6c0,
                                              (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            local_1b8 = pRVar10;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6c0,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6b8);
          }
          else {
            pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_250,local_5d4._4_4_);
            if (*pVVar8 == ON_UPPER) {
              pSVar14 = (SPxOut *)
                        upperRational(in_stack_fffffffffffff6c0,
                                      (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
              local_1c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                        *)in_stack_fffffffffffff6c0,
                                       (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
              local_1c8 = pSVar14;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)in_stack_fffffffffffff6c0,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)in_stack_fffffffffffff6b8);
            }
            else {
              pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_250,local_5d4._4_4_);
              if (*pVVar8 == ZERO) {
                local_5d4._0_1_ = false;
                local_5d4._1_1_ = false;
                local_5d4._2_1_ = false;
                local_5d4._3_1_ = 0;
                local_90 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                         *)in_stack_fffffffffffff6c0,
                                        (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
                local_98 = (pointer)&local_5d4;
                local_10 = local_98;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)in_stack_fffffffffffff6c0,(longlong)in_stack_fffffffffffff6b8);
              }
              else {
                pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                   (local_250,local_5d4._4_4_);
                if (*pVVar8 != FIXED) {
                  if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                     (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
                    pSVar14 = &in_RDI->spxout;
                    local_5d8 = SPxOut::getVerbosity(pSVar14);
                    local_5dc = INFO1;
                    SPxOut::setVerbosity(pSVar14,&local_5dc);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,
                                       (char *)in_stack_fffffffffffff6b8);
                    SPxOut::setVerbosity(&in_RDI->spxout,&local_5d8);
                  }
                  *in_stack_00000008 = 1;
                  goto LAB_00475832;
                }
                pDVar15 = (DataArray<soplex::SPxBasisBase<double>::Desc::Status> *)
                          lowerRational(in_stack_fffffffffffff6c0,
                                        (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
                local_1d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                          *)in_stack_fffffffffffff6c0,
                                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
                local_1d8 = pDVar15;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)in_stack_fffffffffffff6c0,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)in_stack_fffffffffffff6b8);
              }
            }
          }
        }
      }
      numRowsRational((SoPlexBase<double> *)0x4754d4);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffff758,in_stack_fffffffffffff754,(bool)in_stack_fffffffffffff753
             );
      (*(in_RDI->_rationalLP->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._vptr_ClassArray[0x46])(in_RDI->_rationalLP,local_240,&local_240[1].status,1);
      *(byte *)&local_240[0xd]._vptr_Timer = *(byte *)&local_240[0xd]._vptr_Timer | 1;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffff6c0,
                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffff6b8);
      local_628._72_4_ = 0;
      while (iVar3 = local_628._72_4_, iVar7 = numColsRational((SoPlexBase<double> *)0x475575),
            iVar3 < iVar7) {
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_250,local_628._72_4_);
        if (*pVVar8 == BASIC) {
          local_628._68_4_ = 0;
          local_a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff6c0,
                                  (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          local_a8 = (pointer)(local_628 + 0x44);
          local_8 = local_a8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffff6c0,(longlong)in_stack_fffffffffffff6b8);
        }
        else {
          pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_250,local_628._72_4_);
          iVar5 = (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
          if (*pVVar8 == FIXED) {
            val = colVectorRational(in_stack_fffffffffffff6c0,iVar5);
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator*((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)in_stack_fffffffffffff788,
                        (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)CONCAT44(SVar19,in_stack_fffffffffffff780));
            local_210 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                      *)in_stack_fffffffffffff6c0,
                                     (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            this_00 = (SoPlexBase<double> *)local_628;
            local_218 = this_00;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6c0,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6b8);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x4756c2);
            objRational(this_00,(int)((ulong)in_stack_fffffffffffff6c0 >> 0x20));
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff6c0,
                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::operator-=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(iVar7,iVar3),(self_type *)val);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x475717);
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff6c0,
                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)this_00,(int *)in_stack_fffffffffffff6c0);
          }
          else {
            in_stack_fffffffffffff6c0 =
                 (SoPlexBase<double> *)
                 VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)in_stack_fffffffffffff6c0,iVar5);
            local_1e0 = (DataArray<soplex::SPxBasisBase<double>::Desc::Status> *)
                        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                      *)in_stack_fffffffffffff6c0,
                                     (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
            local_1e8 = in_stack_fffffffffffff6c0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6c0,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffff6b8);
          }
        }
        local_628._72_4_ = local_628._72_4_ + 1;
      }
      *(byte *)&local_240[0xd]._vptr_Timer = *(byte *)&local_240[0xd]._vptr_Timer & 0xfb | 4;
    }
    else {
      SLUFactorRational::clear((SLUFactorRational *)in_stack_fffffffffffff6c0);
    }
  }
  else {
    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
       (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
      local_418.super_ClassArray<soplex::Nonzero<double>_>.data._4_4_ =
           SPxOut::getVerbosity(&in_RDI->spxout);
      local_418.super_ClassArray<soplex::Nonzero<double>_>.data._0_4_ = 3;
      SPxOut::setVerbosity
                (&in_RDI->spxout,
                 (Verbosity *)&local_418.super_ClassArray<soplex::Nonzero<double>_>.data);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
      SPxOut::setVerbosity
                (&in_RDI->spxout,
                 (Verbosity *)((long)&local_418.super_ClassArray<soplex::Nonzero<double>_>.data + 4)
                );
    }
    *in_stack_00000008 = 1;
  }
LAB_00475832:
  (*in_RDI->_statistics->rationalTime->_vptr_Timer[4])();
LAB_00475858:
  local_418.super_ClassArray<soplex::Nonzero<double>_>.themax = 1;
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x475865);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x475872);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x47587f);
  return;
}

Assistant:

void SoPlexBase<R>::factorizeColumnRational(SolRational& sol,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols, bool& stoppedTime,
      bool& stoppedIter, bool& error, bool& optimal)
{
   // start rational solving time
   _statistics->rationalTime->start();

   stoppedTime = false;
   stoppedIter = false;
   error = false;
   optimal = false;

   const bool maximizing = (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE);
   const int matrixdim = numRowsRational();
   bool loadMatrix = (_rationalLUSolver.status() == SLinSolverRational::UNLOADED
                      || _rationalLUSolver.status() == SLinSolverRational::TIME);
   int numBasicRows;

   assert(loadMatrix || matrixdim == _rationalLUSolver.dim());
   assert(loadMatrix || matrixdim == _rationalLUSolverBind.size());

   if(!loadMatrix && (matrixdim != _rationalLUSolver.dim()
                      || matrixdim != _rationalLUSolverBind.size()))
   {
      SPX_MSG_WARNING(spxout, spxout <<
                      "Warning: dimensioning error in rational matrix factorization (recovered).\n");
      loadMatrix = true;
   }

   _workSol._primal.reDim(matrixdim);
   _workSol._slacks.reDim(matrixdim);
   _workSol._dual.reDim(matrixdim);
   _workSol._redCost.reDim(numColsRational() > matrixdim ? numColsRational() : matrixdim);

   if(loadMatrix)
      _rationalLUSolverBind.reSize(matrixdim);

   VectorRational& basicPrimalRhs = _workSol._slacks;
   VectorRational& basicDualRhs = _workSol._redCost;
   VectorRational& basicPrimal = _workSol._primal;
   VectorRational& basicDual = _workSol._dual;

   Rational violation;
   Rational primalViolation;
   Rational dualViolation;
   bool primalFeasible = false;
   bool dualFeasible = false;

   assert(basisStatusCols.size() == numColsRational());
   assert(basisStatusRows.size() == numRowsRational());

   int j = 0;

   for(int i = 0; i < basisStatusRows.size(); i++)
   {
      if(basisStatusRows[i] == SPxSolverBase<R>::BASIC && j < matrixdim)
      {
         basicPrimalRhs[i] = 0;
         basicDualRhs[j] = 0;

         if(loadMatrix)
            _rationalLUSolverBind[j] = -1 - i;

         j++;
      }
      else if(basisStatusRows[i] == SPxSolverBase<R>::ON_LOWER)
         basicPrimalRhs[i] = lhsRational(i);
      else if(basisStatusRows[i] == SPxSolverBase<R>::ON_UPPER)
         basicPrimalRhs[i] = rhsRational(i);
      else if(basisStatusRows[i] == SPxSolverBase<R>::ZERO)
         basicPrimalRhs[i] = 0;
      else if(basisStatusRows[i] == SPxSolverBase<R>::FIXED)
      {
         assert(lhsRational(i) == rhsRational(i));
         basicPrimalRhs[i] = lhsRational(i);
      }
      else if(basisStatusRows[i] == SPxSolverBase<R>::UNDEFINED)
      {
         SPX_MSG_INFO1(spxout, spxout << "Undefined basis status of row in rational factorization.\n");
         error = true;
         goto TERMINATE;
      }
      else
      {
         assert(basisStatusRows[i] == SPxSolverBase<R>::BASIC);
         SPX_MSG_INFO1(spxout, spxout << "Too many basic rows in rational factorization.\n");
         error = true;
         goto TERMINATE;
      }
   }

   numBasicRows = j;

   for(int i = 0; i < basisStatusCols.size(); i++)
   {
      if(basisStatusCols[i] == SPxSolverBase<R>::BASIC && j < matrixdim)
      {
         basicDualRhs[j] = objRational(i);

         if(loadMatrix)
            _rationalLUSolverBind[j] = i;

         j++;
      }
      else if(basisStatusCols[i] == SPxSolverBase<R>::ON_LOWER)
         basicPrimalRhs.multAdd(-lowerRational(i), colVectorRational(i));
      else if(basisStatusCols[i] == SPxSolverBase<R>::ON_UPPER)
         basicPrimalRhs.multAdd(-upperRational(i), colVectorRational(i));
      else if(basisStatusCols[i] == SPxSolverBase<R>::ZERO)
      {}
      else if(basisStatusCols[i] == SPxSolverBase<R>::FIXED)
      {
         assert(lowerRational(i) == upperRational(i));
         basicPrimalRhs.multAdd(-lowerRational(i), colVectorRational(i));
      }
      else if(basisStatusCols[i] == SPxSolverBase<R>::UNDEFINED)
      {
         SPX_MSG_INFO1(spxout, spxout << "Undefined basis status of column in rational factorization.\n");
         error = true;
         goto TERMINATE;
      }
      else
      {
         assert(basisStatusCols[i] == SPxSolverBase<R>::BASIC);
         SPX_MSG_INFO1(spxout, spxout << "Too many basic columns in rational factorization.\n");
         error = true;
         goto TERMINATE;
      }
   }

   if(j != matrixdim)
   {
      SPX_MSG_INFO1(spxout, spxout << "Too few basic entries in rational factorization.\n");
      error = true;
      goto TERMINATE;
   }

   // load and factorize rational basis matrix
   if(loadMatrix)
      _computeBasisInverseRational();

   if(_rationalLUSolver.status() == SLinSolverRational::TIME)
   {
      stoppedTime = true;
      return;
   }
   else if(_rationalLUSolver.status() != SLinSolverRational::OK)
   {
      error = true;
      return;
   }

   assert(_rationalLUSolver.status() == SLinSolverRational::OK);

   // solve for primal solution
   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _rationalLUSolver.setTimeLimit(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                     _statistics->solvingTime->time());
   else
      _rationalLUSolver.setTimeLimit(-1.0);

   _rationalLUSolver.solveRight(basicPrimal, basicPrimalRhs);

   // record statistics
   _statistics->luSolveTimeRational += _rationalLUSolver.getSolveTime();
   _rationalLUSolver.resetCounters();

   if(_isSolveStopped(stoppedTime, stoppedIter))
   {
      SPX_MSG_INFO2(spxout, spxout <<
                    "Rational factorization hit time limit while solving for primal.\n");
      return;
   }

   // check bound violation on basic rows and columns
   j = 0;
   primalViolation = 0;
   primalFeasible = true;

   for(int i = 0; i < basisStatusRows.size(); i++)
   {
      if(basisStatusRows[i] == SPxSolverBase<R>::BASIC)
      {
         assert(j < matrixdim);
         assert(_rationalLUSolverBind[j] == -1 - i);
         violation = lhsRational(i);
         violation += basicPrimal[j];

         if(violation > primalViolation)
         {
            primalFeasible = false;
            primalViolation = violation;
         }

         violation = rhsRational(i);
         violation += basicPrimal[j];
         violation *= -1;

         if(violation > primalViolation)
         {
            primalFeasible = false;
            primalViolation = violation;
         }

         j++;
      }
   }

   for(int i = 0; i < basisStatusCols.size(); i++)
   {
      if(basisStatusCols[i] == SPxSolverBase<R>::BASIC)
      {
         assert(j < matrixdim);
         assert(_rationalLUSolverBind[j] == i);

         if(basicPrimal[j] < lowerRational(i))
         {
            violation = lowerRational(i);
            violation -= basicPrimal[j];

            if(violation > primalViolation)
            {
               primalFeasible = false;
               primalViolation = violation;
            }
         }

         if(basicPrimal[j] > upperRational(i))
         {
            violation = basicPrimal[j];
            violation -= upperRational(i);

            if(violation > primalViolation)
            {
               primalFeasible = false;
               primalViolation = violation;
            }
         }

         j++;
      }
   }

   if(!primalFeasible)
   {
      SPX_MSG_INFO1(spxout, spxout << "Rational solution primal infeasible.\n");
   }

   // solve for dual solution
   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _rationalLUSolver.setTimeLimit(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                     _statistics->solvingTime->time());
   else
      _rationalLUSolver.setTimeLimit(-1.0);

   _rationalLUSolver.solveLeft(basicDual, basicDualRhs);

   // record statistics
   _statistics->luSolveTimeRational += _rationalLUSolver.getSolveTime();
   _rationalLUSolver.resetCounters();

   if(_isSolveStopped(stoppedTime, stoppedIter))
   {
      SPX_MSG_INFO2(spxout, spxout << "Rational factorization hit time limit while solving for dual.\n");
      return;
   }

   // check dual violation on nonbasic rows
   dualViolation = 0;
   dualFeasible = true;

   for(int i = 0; i < basisStatusRows.size(); i++)
   {
      if(_rowTypes[i] == RANGETYPE_FIXED
            && (basisStatusRows[i] == SPxSolverBase<R>::ON_LOWER
                || basisStatusRows[i] == SPxSolverBase<R>::ON_UPPER))
      {
         assert(lhsRational(i) == rhsRational(i));
         basisStatusRows[i] = SPxSolverBase<R>::FIXED;
      }

      assert(basisStatusRows[i] != SPxSolverBase<R>::BASIC || basicDual[i] == 0);

      if(basisStatusRows[i] == SPxSolverBase<R>::BASIC || basisStatusRows[i] == SPxSolverBase<R>::FIXED)
         continue;
      else if(basicDual[i] < 0)
      {
         if(((maximizing && basisStatusRows[i] != SPxSolverBase<R>::ON_LOWER) || (!maximizing
               && basisStatusRows[i] != SPxSolverBase<R>::ON_UPPER))
               && (basisStatusRows[i] != SPxSolverBase<R>::ZERO || rhsRational(i) != 0))
         {
            dualFeasible = false;
            violation = -basicDual[i];

            if(violation > dualViolation)
               dualViolation = violation;

            SPxOut::debug(this,
                          "negative dual multliplier for row {} with dual {} and status {} and [lhs,rhs] = [{},{}]\n",
                          i, basicDual[i].str(), basisStatusRows[i], lhsRational(i).str(), rhsRational(i).str());
         }
      }
      else if(basicDual[i] > 0)
      {
         if(((maximizing && basisStatusRows[i] != SPxSolverBase<R>::ON_UPPER) || (!maximizing
               && basisStatusRows[i] != SPxSolverBase<R>::ON_LOWER))
               && (basisStatusRows[i] != SPxSolverBase<R>::ZERO || lhsRational(i) == 0))
         {
            dualFeasible = false;

            if(basicDual[i] > dualViolation)
               dualViolation = basicDual[i];

            SPxOut::debug(this,
                          "positive dual multliplier for row {} with dual {} and status {} and [lhs,rhs] = [{},{}]\n",
                          i, basicDual[i].str(), basisStatusRows[i], lhsRational(i).str(), rhsRational(i).str());
         }
      }
   }

   // check reduced cost violation on nonbasic columns
   for(int i = 0; i < basisStatusCols.size(); i++)
   {
      if(_colTypes[i] == RANGETYPE_FIXED
            && (basisStatusCols[i] == SPxSolverBase<R>::ON_LOWER
                || basisStatusCols[i] == SPxSolverBase<R>::ON_UPPER))
      {
         assert(lowerRational(i) == upperRational(i));
         basisStatusCols[i] = SPxSolverBase<R>::FIXED;
      }

      assert(basisStatusCols[i] != SPxSolverBase<R>::BASIC
             || basicDual * colVectorRational(i) == objRational(i));

      if(basisStatusCols[i] == SPxSolverBase<R>::BASIC || basisStatusCols[i] == SPxSolverBase<R>::FIXED)
         continue;
      else
      {
         _workSol._redCost[i] = basicDual * colVectorRational(i);
         _workSol._redCost[i] -= objRational(i);

         if(_workSol._redCost[i] > 0)
         {
            if(((maximizing && basisStatusCols[i] != SPxSolverBase<R>::ON_LOWER) || (!maximizing
                  && basisStatusCols[i] != SPxSolverBase<R>::ON_UPPER))
                  && (basisStatusCols[i] != SPxSolverBase<R>::ZERO || upperRational(i) != 0))
            {
               dualFeasible = false;

               if(_workSol._redCost[i] > dualViolation)
                  dualViolation = _workSol._redCost[i];
            }

            _workSol._redCost[i] *= -1;
         }
         else if(_workSol._redCost[i] < 0)
         {
            _workSol._redCost[i] *= -1;

            if(((maximizing && basisStatusCols[i] != SPxSolverBase<R>::ON_UPPER) || (!maximizing
                  && basisStatusCols[i] != SPxSolverBase<R>::ON_LOWER))
                  && (basisStatusCols[i] != SPxSolverBase<R>::ZERO || lowerRational(i) != 0))
            {
               dualFeasible = false;

               if(_workSol._redCost[i] > dualViolation)
                  dualViolation = _workSol._redCost[i];
            }
         }
         else
            _workSol._redCost[i] *= -1;
      }
   }

   if(!dualFeasible)
   {
      SPX_MSG_INFO1(spxout, spxout << "Rational solution dual infeasible.\n");
   }

   // store solution
   optimal = primalFeasible && dualFeasible;

   if(optimal || boolParam(SoPlexBase<R>::RATFACJUMP))
   {
      _hasBasis = true;

      if(&basisStatusRows != &_basisStatusRows)
         _basisStatusRows = basisStatusRows;

      if(&basisStatusCols != &_basisStatusCols)
         _basisStatusCols = basisStatusCols;

      sol._primal.reDim(numColsRational());
      j = numBasicRows;

      for(int i = 0; i < basisStatusCols.size(); i++)
      {
         if(basisStatusCols[i] == SPxSolverBase<R>::BASIC)
         {
            assert(j < matrixdim);
            assert(_rationalLUSolverBind[j] == i);
            sol._primal[i] = basicPrimal[j];
            j++;
         }
         else if(basisStatusCols[i] == SPxSolverBase<R>::ON_LOWER)
            sol._primal[i] = lowerRational(i);
         else if(basisStatusCols[i] == SPxSolverBase<R>::ON_UPPER)
            sol._primal[i] = upperRational(i);
         else if(basisStatusCols[i] == SPxSolverBase<R>::ZERO)
            sol._primal[i] = 0;
         else if(basisStatusCols[i] == SPxSolverBase<R>::FIXED)
         {
            assert(lowerRational(i) == upperRational(i));
            sol._primal[i] = lowerRational(i);
         }
         else
         {
            assert(basisStatusCols[i] == SPxSolverBase<R>::UNDEFINED);
            SPX_MSG_INFO1(spxout, spxout << "Undefined basis status of column in rational factorization.\n");
            error = true;
            goto TERMINATE;
         }
      }

      sol._slacks.reDim(numRowsRational());
      _rationalLP->computePrimalActivity(sol._primal, sol._slacks);
      sol._isPrimalFeasible = true;

      sol._dual = basicDual;

      for(int i = 0; i < numColsRational(); i++)
      {
         if(basisStatusCols[i] == SPxSolverBase<R>::BASIC)
            sol._redCost[i] = 0;
         else if(basisStatusCols[i] == SPxSolverBase<R>::FIXED)
         {
            sol._redCost[i] = basicDual * colVectorRational(i);
            sol._redCost[i] -= objRational(i);
            sol._redCost[i] *= -1;
         }
         else
            sol._redCost[i] = _workSol._redCost[i];
      }

      sol._isDualFeasible  = true;
   }
   else
   {
      _rationalLUSolver.clear();
   }


TERMINATE:
   // stop rational solving time
   _statistics->rationalTime->stop();
   return;
}